

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

Stream * __thiscall kratos::Stream::operator<<(Stream *this,AssignStmt *stmt)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  StmtException *pSVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long lVar7;
  ulong uVar8;
  string_view sVar9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<kratos::IRNode_*> __l_01;
  Var *local_110;
  anon_class_8_1_8991fb9c var_str_func;
  undefined1 auStack_f8 [8];
  string right;
  string left;
  string eq;
  string prefix;
  anon_class_16_2_0738fce5 output_delay;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  right_wrapped;
  allocator_type local_31;
  
  var_str_abi_cxx11_((string *)((long)&right.field_2 + 8),this,stmt->left_);
  var_str_abi_cxx11_((string *)auStack_f8,this,stmt->right_);
  if ((stmt->super_Stmt).super_IRNode.comment._M_string_length != 0) {
    puVar1 = &(this->super_stringstream).field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"// ",3);
    strip_newline((string *)auStack_58,&(stmt->super_Stmt).super_IRNode.comment);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(char *)auStack_58,
                        (long)right_wrapped.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    puVar2 = &(this->super_stringstream).field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    eq.field_2._M_local_buf[8] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,eq.field_2._M_local_buf + 8,1);
    if (auStack_58 !=
        (undefined1  [8])
        &right_wrapped.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)auStack_58,
                      (ulong)((long)&((right_wrapped.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                     _M_p + 1));
    }
    sVar9 = SystemVerilogCodeGen::indent
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,sVar9._M_str,sVar9._M_len);
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (stmt->super_Stmt).super_IRNode.verilog_ln = *(uint32_t *)&(this->super_stringstream).field_0x90
    ;
  }
  eq.field_2._8_8_ = &prefix._M_string_length;
  prefix._M_dataplus._M_p = (pointer)0x0;
  prefix._M_string_length._0_1_ = 0;
  left.field_2._8_8_ = &eq._M_string_length;
  eq._M_dataplus._M_p = (pointer)0x0;
  eq._M_string_length._0_1_ = 0;
  iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[4])(stmt);
  if (CONCAT44(extraout_var,iVar3) == *(long *)&(this->super_stringstream).field_0x80) {
    if (stmt->assign_type_ != Blocking) {
      pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
      auStack_58 = (undefined1  [8])right.field_2._8_8_;
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)left._M_dataplus._M_p;
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_f8;
      right_wrapped.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)right._M_dataplus._M_p;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0x36;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)((long)&prefix.field_2 + 8),
                 (detail *)"Top level assignment for {0} <- {1} has to be blocking",format_str,args)
      ;
      local_110 = stmt->left_;
      var_str_func.this = (Stream *)stmt->right_;
      __l._M_len = 3;
      __l._M_array = (iterator)&local_110;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
                 &local_31);
      StmtException::StmtException
                (pSVar5,(string *)((long)&prefix.field_2 + 8),
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
      __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
        super__Optional_payload_base<kratos::EventControl>.field_0x24 == '\x01') {
      pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
      auStack_58 = (undefined1  [8])
                   &right_wrapped.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Continuous assignment cannot have delay","");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_110;
      local_110 = (Var *)stmt;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                 ((long)&prefix.field_2 + 8),__l_00,&local_31);
      StmtException::StmtException
                (pSVar5,(string *)auStack_58,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                 ((long)&prefix.field_2 + 8));
      __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_replace
              ((ulong)((long)&eq.field_2 + 8),0,prefix._M_dataplus._M_p,0x23d1c5);
  }
  else {
    sVar9 = SystemVerilogCodeGen::indent
                      (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    std::__cxx11::string::_M_replace
              ((ulong)((long)&eq.field_2 + 8),0,prefix._M_dataplus._M_p,(ulong)sVar9._M_str);
    if (stmt->assign_type_ != Blocking) {
      if (stmt->assign_type_ != NonBlocking) {
        pSVar5 = (StmtException *)__cxa_allocate_exception(0x10);
        auStack_58 = (undefined1  [8])right.field_2._8_8_;
        right_wrapped.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)left._M_dataplus._M_p;
        right_wrapped.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_f8;
        right_wrapped.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)right._M_dataplus._M_p;
        format_str_00.size_ = 0xdd;
        format_str_00.data_ = (char *)0x36;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_58;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)((long)&prefix.field_2 + 8),
                   (detail *)"Top level assignment for {0} <- {1} has to be blocking",format_str_00,
                   args_00);
        local_110 = stmt->left_;
        var_str_func.this = (Stream *)stmt->right_;
        __l_01._M_len = 3;
        __l_01._M_array = (iterator)&local_110;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l_01,
                   &local_31);
        StmtException::StmtException
                  (pSVar5,(string *)((long)&prefix.field_2 + 8),
                   (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
        __cxa_throw(pSVar5,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar6 = "<=";
      goto LAB_0016391f;
    }
  }
  pcVar6 = "=";
LAB_0016391f:
  std::__cxx11::string::_M_replace
            ((ulong)((long)&left.field_2 + 8),0,eq._M_dataplus._M_p,(ulong)pcVar6);
  puVar1 = &(this->super_stringstream).field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(char *)eq.field_2._8_8_,(long)prefix._M_dataplus._M_p);
  local_110 = (Var *)this;
  prefix.field_2._8_8_ = this;
  if (((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
       super__Optional_payload_base<kratos::EventControl>.field_0x24 == '\x01') &&
     (*(int *)((long)&(stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>.
                      _M_payload.super__Optional_payload_base<kratos::EventControl>._M_payload +
              0x1c) == 0)) {
    operator<<::anon_class_16_2_0738fce5::operator()
              ((anon_class_16_2_0738fce5 *)((long)&prefix.field_2 + 8),
               (EventControl *)
               ((long)&(stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>.
                       _M_payload.super__Optional_payload_base<kratos::EventControl>._M_payload + 4)
              );
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(char *)right.field_2._8_8_,(long)left._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)left.field_2._8_8_,(long)eq._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  if (((stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
       super__Optional_payload_base<kratos::EventControl>.field_0x24 == '\x01') &&
     (*(int *)((long)&(stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>.
                      _M_payload.super__Optional_payload_base<kratos::EventControl>._M_payload +
              0x1c) == 1)) {
    operator<<::anon_class_16_2_0738fce5::operator()
              ((anon_class_16_2_0738fce5 *)((long)&prefix.field_2 + 8),
               (EventControl *)
               ((long)&(stmt->delay_).super__Optional_base<kratos::EventControl,_true,_true>.
                       _M_payload.super__Optional_payload_base<kratos::EventControl>._M_payload + 4)
              );
  }
  line_wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58,(string *)auStack_f8,
            *(uint32_t *)(*(long *)&(this->super_stringstream).field_0x88 + 0xb8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,*(char **)auStack_58,*(long *)((long)auStack_58 + 8));
  if (0x20 < (ulong)((long)right_wrapped.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58)) {
    uVar8 = 1;
    lVar7 = 0x28;
    do {
      puVar2 = &(this->super_stringstream).field_0x90;
      *(long *)puVar2 = *(long *)puVar2 + 1;
      local_31 = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_31,1);
      sVar9 = SystemVerilogCodeGen::indent
                        (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,sVar9._M_str,sVar9._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,*(char **)((long)auStack_58 + lVar7 + -8),
                 *(long *)((long)auStack_58 + lVar7));
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar8 < (ulong)((long)right_wrapped.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 5
                            ));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,";",1);
  puVar2 = &(this->super_stringstream).field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  local_31 = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_31,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_58);
  if ((size_type *)left.field_2._8_8_ != &eq._M_string_length) {
    operator_delete((void *)left.field_2._8_8_,
                    CONCAT71(eq._M_string_length._1_7_,(undefined1)eq._M_string_length) + 1);
  }
  if ((size_type *)eq.field_2._8_8_ != &prefix._M_string_length) {
    operator_delete((void *)eq.field_2._8_8_,
                    CONCAT71(prefix._M_string_length._1_7_,(undefined1)prefix._M_string_length) + 1)
    ;
  }
  if (auStack_f8 != (undefined1  [8])&right._M_string_length) {
    operator_delete((void *)auStack_f8,right._M_string_length + 1);
  }
  if ((size_type *)right.field_2._8_8_ != &left._M_string_length) {
    operator_delete((void *)right.field_2._8_8_,left._M_string_length + 1);
  }
  return this;
}

Assistant:

Stream& Stream::operator<<(AssignStmt* stmt) {
    const auto left = var_str(stmt->left());
    const auto right = var_str(stmt->right());
    if (!stmt->comment.empty()) {
        (*this) << "// " << strip_newline(stmt->comment) << endl();
        (*this) << codegen_->indent();
    }

    if (generator_->debug) {
        stmt->verilog_ln = line_no_;
    }

    std::string prefix;
    std::string eq;

    if (stmt->parent() == generator_) {
        // top level
        if (stmt->assign_type() != AssignmentType::Blocking)
            throw StmtException(
                ::format("Top level assignment for {0} <- {1} has to be blocking", left, right),
                {stmt->left(), stmt->right(), stmt});
        if (stmt->has_delay()) {
            throw StmtException("Continuous assignment cannot have delay", {stmt});
        }
        prefix = "assign ";
        eq = "=";
    } else {
        prefix = codegen_->indent();
        if (stmt->assign_type() == AssignmentType::Blocking)
            eq = "=";
        else if (stmt->assign_type() == AssignmentType::NonBlocking)
            eq = "<=";
        else
            throw StmtException(
                ::format("Top level assignment for {0} <- {1} has to be blocking", left, right),
                {stmt->left(), stmt->right(), stmt});
    }

    (*this) << prefix;
    auto var_str_func = [this](const Var* v) { return var_str(v); };
    auto output_delay = [this, &var_str_func](const EventControl& e) {
        switch (e.type) {
            case EventControlType::Delay: {
                (*this) << e.to_string(var_str_func) << ' ';
                break;
            }
            case EventControlType::Edge: {
                (*this) << "@(" << e.to_string(var_str_func) << ") ";
            }
        }
    };
    // lhs delay
    if (stmt->has_delay() && stmt->get_delay()->delay_side == EventControl::DelaySide::left) {
        // this is a lhs delay
        output_delay(*stmt->get_delay());
    }

    (*this) << left << " " << eq << " ";  //<< right << ";" << endl();

    // rhs delay
    if (stmt->has_delay() && stmt->get_delay()->delay_side == EventControl::DelaySide::right) {
        // this is a rhs delay
        output_delay(*stmt->get_delay());
    }

    auto right_wrapped = line_wrap(right, codegen_->options().line_wrap);
    (*this) << right_wrapped[0];
    for (uint64_t i = 1; i < right_wrapped.size(); i++) {
        // compute new indent
        (*this) << endl();
        (*this) << codegen_->indent() << "    " << right_wrapped[i];
    }
    (*this) << ";" << endl();
    return *this;
}